

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void integer_suite::test_hundred(void)

{
  undefined4 local_168;
  value local_164 [2];
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [4];
  
  decoder.current.scan._260_4_ = 0x303031;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<4ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [4])((long)&decoder.current.scan + 0x104));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a0,"void integer_suite::test_hundred()",local_148,&local_14c);
  local_158 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>
                        ((basic_decoder<char> *)local_140);
  local_15c = 100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a1,"void integer_suite::test_hundred()",&local_158,&local_15c);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_140);
  local_164[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_168 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1a3,"void integer_suite::test_hundred()",local_164,&local_168);
  return;
}

Assistant:

void test_hundred()
{
    const char input[] = "100";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<std::int64_t>(), 100);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}